

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevent_fork.h
# Opt level: O0

void snmalloc::PreventFork::prefork(void)

{
  long lVar1;
  Atomic<size_t> AVar2;
  __atomic_base<unsigned_long> _Var3;
  __atomic_base<unsigned_long> _Var4;
  __atomic_base<unsigned_long> _Var5;
  __atomic_base<unsigned_long> _Var6;
  undefined8 *in_FS_OFFSET;
  bool bVar7;
  __int_type_conflict current;
  memory_order __b_1;
  memory_order __b;
  __atomic_base<unsigned_long> local_88;
  __atomic_base<unsigned_long> local_80;
  memory_order local_78;
  undefined4 local_74;
  Atomic<size_t> *local_70;
  __atomic_base<unsigned_long> local_68;
  memory_order local_60;
  undefined4 local_5c;
  Atomic<size_t> *local_58;
  undefined4 local_4c;
  __int_type_conflict local_48;
  __atomic_base<unsigned_long> *local_40;
  Atomic<size_t> *local_38;
  bool local_29;
  __int_type_conflict local_28;
  memory_order local_20;
  undefined4 local_1c;
  __int_type_conflict local_18;
  __atomic_base<unsigned_long> *local_10;
  Atomic<size_t> *local_8;
  
  lVar1 = *(long *)*in_FS_OFFSET;
  *(long *)*in_FS_OFFSET = lVar1 + 1;
  if (lVar1 != 0) {
    return;
  }
  if (*(long *)*in_FS_OFFSET == 0) {
    do {
      local_58 = &threads_preventing_fork;
      local_5c = 5;
      local_60 = std::operator&(seq_cst,__memory_order_mask);
      local_68 = threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
      local_88 = threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
      if (((ulong)threads_preventing_fork.super___atomic_base<unsigned_long>._M_i & 1) == 0) {
        _Var5 = threads_preventing_fork.super___atomic_base<unsigned_long>._M_i + 1;
        local_38 = &threads_preventing_fork;
        local_4c = 5;
        local_48 = _Var5._M_i;
        local_40 = &local_88;
        local_20 = std::__cmpexch_failure_order(relaxed);
        _Var3._M_i = local_88._M_i;
        AVar2 = threads_preventing_fork;
        local_8 = &threads_preventing_fork;
        local_1c = 5;
        switch(0x10b74a) {
        default:
          if (local_20 - consume < 2) {
            LOCK();
            bVar7 = (__atomic_base<unsigned_long>)local_88._M_i !=
                    threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
            _Var6._M_i = local_88._M_i;
            _Var4._M_i = _Var5._M_i;
            if (bVar7) {
              _Var6 = threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
              _Var4 = threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
            }
            threads_preventing_fork.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
            UNLOCK();
            if (bVar7) {
              local_88._M_i = _Var6._M_i;
            }
          }
          else if (local_20 == seq_cst) {
            LOCK();
            bVar7 = (__atomic_base<unsigned_long>)local_88._M_i !=
                    threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
            _Var6._M_i = local_88._M_i;
            _Var4._M_i = _Var5._M_i;
            if (bVar7) {
              _Var6 = threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
              _Var4 = threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
            }
            threads_preventing_fork.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
            UNLOCK();
            if (bVar7) {
              local_88._M_i = _Var6._M_i;
            }
          }
          else {
            LOCK();
            bVar7 = (__atomic_base<unsigned_long>)local_88._M_i !=
                    threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
            _Var6._M_i = local_88._M_i;
            _Var4._M_i = _Var5._M_i;
            if (bVar7) {
              _Var6 = threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
              _Var4 = threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
            }
            threads_preventing_fork.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
            UNLOCK();
            if (bVar7) {
              local_88._M_i = _Var6._M_i;
            }
          }
          break;
        case 2:
          if (local_20 - consume < 2) {
            LOCK();
            bVar7 = (__atomic_base<unsigned_long>)local_88._M_i !=
                    threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
            _Var6._M_i = local_88._M_i;
            _Var4._M_i = _Var5._M_i;
            if (bVar7) {
              _Var6 = threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
              _Var4 = threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
            }
            threads_preventing_fork.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
            UNLOCK();
            if (bVar7) {
              local_88._M_i = _Var6._M_i;
            }
          }
          else if (local_20 == seq_cst) {
            LOCK();
            bVar7 = (__atomic_base<unsigned_long>)local_88._M_i !=
                    threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
            _Var6._M_i = local_88._M_i;
            _Var4._M_i = _Var5._M_i;
            if (bVar7) {
              _Var6 = threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
              _Var4 = threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
            }
            threads_preventing_fork.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
            UNLOCK();
            if (bVar7) {
              local_88._M_i = _Var6._M_i;
            }
          }
          else {
            LOCK();
            bVar7 = (__atomic_base<unsigned_long>)local_88._M_i !=
                    threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
            _Var6._M_i = local_88._M_i;
            _Var4._M_i = _Var5._M_i;
            if (bVar7) {
              _Var6 = threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
              _Var4 = threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
            }
            threads_preventing_fork.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
            UNLOCK();
            if (bVar7) {
              local_88._M_i = _Var6._M_i;
            }
          }
          break;
        case 3:
          if (local_20 - consume < 2) {
            LOCK();
            bVar7 = (__atomic_base<unsigned_long>)local_88._M_i !=
                    threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
            _Var6._M_i = local_88._M_i;
            _Var4._M_i = _Var5._M_i;
            if (bVar7) {
              _Var6 = threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
              _Var4 = threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
            }
            threads_preventing_fork.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
            UNLOCK();
            if (bVar7) {
              local_88._M_i = _Var6._M_i;
            }
          }
          else if (local_20 == seq_cst) {
            LOCK();
            bVar7 = (__atomic_base<unsigned_long>)local_88._M_i !=
                    threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
            _Var6._M_i = local_88._M_i;
            _Var4._M_i = _Var5._M_i;
            if (bVar7) {
              _Var6 = threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
              _Var4 = threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
            }
            threads_preventing_fork.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
            UNLOCK();
            if (bVar7) {
              local_88._M_i = _Var6._M_i;
            }
          }
          else {
            LOCK();
            bVar7 = (__atomic_base<unsigned_long>)local_88._M_i !=
                    threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
            _Var6._M_i = local_88._M_i;
            _Var4._M_i = _Var5._M_i;
            if (bVar7) {
              _Var6 = threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
              _Var4 = threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
            }
            threads_preventing_fork.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
            UNLOCK();
            if (bVar7) {
              local_88._M_i = _Var6._M_i;
            }
          }
          break;
        case 4:
          if (local_20 - consume < 2) {
            LOCK();
            bVar7 = (__atomic_base<unsigned_long>)local_88._M_i !=
                    threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
            _Var6._M_i = local_88._M_i;
            _Var4._M_i = _Var5._M_i;
            if (bVar7) {
              _Var6 = threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
              _Var4 = threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
            }
            threads_preventing_fork.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
            UNLOCK();
            if (bVar7) {
              local_88._M_i = _Var6._M_i;
            }
          }
          else if (local_20 == seq_cst) {
            LOCK();
            bVar7 = (__atomic_base<unsigned_long>)local_88._M_i !=
                    threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
            _Var6._M_i = local_88._M_i;
            _Var4._M_i = _Var5._M_i;
            if (bVar7) {
              _Var6 = threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
              _Var4 = threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
            }
            threads_preventing_fork.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
            UNLOCK();
            if (bVar7) {
              local_88._M_i = _Var6._M_i;
            }
          }
          else {
            LOCK();
            bVar7 = (__atomic_base<unsigned_long>)local_88._M_i !=
                    threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
            _Var6._M_i = local_88._M_i;
            _Var4._M_i = _Var5._M_i;
            if (bVar7) {
              _Var6 = threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
              _Var4 = threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
            }
            threads_preventing_fork.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
            UNLOCK();
            if (bVar7) {
              local_88._M_i = _Var6._M_i;
            }
          }
        }
        local_29 = (__atomic_base<unsigned_long>)_Var3._M_i ==
                   AVar2.super___atomic_base<unsigned_long>._M_i;
        local_28 = _Var5._M_i;
        local_18 = _Var5._M_i;
        local_10 = &local_88;
        if (local_29) {
          while( true ) {
            local_70 = &threads_preventing_fork;
            local_74 = 5;
            local_78 = std::operator&(seq_cst,__memory_order_mask);
            local_80 = threads_preventing_fork.super___atomic_base<unsigned_long>._M_i;
            if (threads_preventing_fork.super___atomic_base<unsigned_long>._M_i == 1) break;
            AAL_x86::pause();
          }
          *(long *)*in_FS_OFFSET = *(long *)*in_FS_OFFSET + 1;
          return;
        }
      }
      AAL_x86::pause();
    } while( true );
  }
  error((char *)0x10b4a7);
}

Assistant:

static void prefork()
    {
      if (depth_of_handlers++ != 0)
        return;

      if (depth_of_prevention != 0)
        error("Fork attempted while in PreventFork region.");

      while (true)
      {
        auto current = threads_preventing_fork.load();
        if (
          (current % 2 == 0) &&
          (threads_preventing_fork.compare_exchange_weak(current, current + 1)))
        {
          break;
        }
        Aal::pause();
      };

      while (threads_preventing_fork.load() != 1)
      {
        Aal::pause();
      }

      // Finally set the flag that allows this thread to enter PreventFork
      // regions This is safe as the only other calls here are to other prefork
      // handlers.
      depth_of_prevention++;
    }